

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void chip_generate(opl_chip *chip,Bit16s *buff)

{
  opl_slot *poVar1;
  Bit8u BVar2;
  uint uVar3;
  byte bVar4;
  Bit16s BVar5;
  Bit16s **ppBVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ushort uVar10;
  Bit8u jj;
  long lVar11;
  long lVar12;
  
  iVar8 = -0x8000;
  if (-0x8000 < chip->mixbuff[1]) {
    iVar8 = chip->mixbuff[1];
  }
  BVar5 = (Bit16s)iVar8;
  if (0x7ffe < iVar8) {
    BVar5 = 0x7fff;
  }
  buff[1] = BVar5;
  for (lVar12 = 0x630; lVar12 != 0x990; lVar12 = lVar12 + 0x48) {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar12);
    slot_calcfb(poVar1);
    pg_generate(poVar1);
    envelope_calc(poVar1);
    slot_generate(poVar1);
  }
  for (lVar12 = 0x990; lVar12 != 0xa68; lVar12 = lVar12 + 0x48) {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar12);
    slot_calcfb(poVar1);
    pg_generate(poVar1);
    envelope_calc(poVar1);
  }
  if ((chip->rhy & 0x20) == 0) {
    slot_generate(chip->slot + 0xc);
    slot_generate(chip->slot + 0xd);
    slot_generate(chip->slot + 0xe);
  }
  else {
    chan_generaterhythm1(chip);
  }
  ppBVar6 = chip->channel[0].out;
  iVar8 = 0;
  for (lVar12 = 0; lVar12 != 0x12; lVar12 = lVar12 + 1) {
    uVar10 = 0;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      uVar10 = uVar10 + *ppBVar6[lVar11];
    }
    if (chip->FullPan == '\0') {
      uVar10 = uVar10 & chip->channel[lVar12].cha;
    }
    else {
      uVar10 = (ushort)(int)((float)(int)(short)uVar10 * chip->channel[lVar12].fcha);
    }
    iVar8 = iVar8 + (short)uVar10;
    ppBVar6 = ppBVar6 + 0xb;
  }
  chip->mixbuff[0] = iVar8;
  for (lVar12 = 0xa68; lVar12 != 0xb40; lVar12 = lVar12 + 0x48) {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar12);
    slot_calcfb(poVar1);
    pg_generate(poVar1);
    envelope_calc(poVar1);
  }
  if ((chip->rhy & 0x20) == 0) {
    slot_generate(chip->slot + 0xf);
    slot_generate(chip->slot + 0x10);
    slot_generate(chip->slot + 0x11);
  }
  else {
    chan_generaterhythm2(chip);
  }
  iVar8 = -0x8000;
  if (-0x8000 < chip->mixbuff[0]) {
    iVar8 = chip->mixbuff[0];
  }
  BVar5 = (Bit16s)iVar8;
  if (0x7ffe < iVar8) {
    BVar5 = 0x7fff;
  }
  *buff = BVar5;
  for (lVar12 = 0; lVar12 != 0x438; lVar12 = lVar12 + 0x48) {
    poVar1 = (opl_slot *)((long)chip->slot[0x12].prout + lVar12 + -0x20);
    slot_calcfb(poVar1);
    pg_generate(poVar1);
    envelope_calc(poVar1);
    slot_generate(poVar1);
  }
  ppBVar6 = chip->channel[0].out;
  iVar8 = 0;
  for (lVar12 = 0; lVar12 != 0x12; lVar12 = lVar12 + 1) {
    uVar10 = 0;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      uVar10 = uVar10 + *ppBVar6[lVar11];
    }
    if (chip->FullPan == '\0') {
      uVar10 = uVar10 & chip->channel[lVar12].chb;
    }
    else {
      uVar10 = (ushort)(int)((float)(int)(short)uVar10 * chip->channel[lVar12].fchb);
    }
    iVar8 = iVar8 + (short)uVar10;
    ppBVar6 = ppBVar6 + 0xb;
  }
  chip->mixbuff[1] = iVar8;
  for (lVar12 = 0; lVar12 != 0xd8; lVar12 = lVar12 + 0x48) {
    poVar1 = (opl_slot *)((long)chip->slot[0x21].prout + lVar12 + -0x20);
    slot_calcfb(poVar1);
    pg_generate(poVar1);
    envelope_calc(poVar1);
    slot_generate(poVar1);
  }
  uVar3._0_2_ = chip->timer;
  uVar3._2_1_ = chip->newm;
  uVar3._3_1_ = chip->nts;
  uVar7 = chip->noise >> 1;
  uVar9 = uVar7 ^ 0x400181;
  if ((chip->noise & 1) == 0) {
    uVar9 = uVar7;
  }
  chip->noise = uVar9;
  if ((~uVar3 & 0x3f) != 0) goto LAB_003448fb;
  BVar2 = chip->tremtval;
  if (chip->tremdir == '\0') {
    if (BVar2 != 'i') {
      bVar4 = BVar2 + 1;
      goto LAB_003448d8;
    }
    chip->tremtval = 'h';
    chip->tremdir = '\x01';
    bVar4 = 0x68;
  }
  else if (BVar2 == '\0') {
    chip->tremtval = '\x01';
    chip->tremdir = '\0';
    bVar4 = 0;
  }
  else {
    bVar4 = BVar2 - 1;
LAB_003448d8:
    chip->tremtval = bVar4;
  }
  chip->tremval = (bVar4 >> 2) >> (chip->dam * -2 + 2 & 0x1f);
LAB_003448fb:
  chip->timer = (undefined2)uVar3 + 1;
  return;
}

Assistant:

void chip_generate(opl_chip *chip, Bit16s *buff) {
	buff[1] = limshort(chip->mixbuff[1]);

	for (Bit8u ii = 0; ii < 12; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	for (Bit8u ii = 12; ii < 15; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm1(chip);
	}
	else {
		slot_generate(&chip->slot[12]);
		slot_generate(&chip->slot[13]);
		slot_generate(&chip->slot[14]);
	}

	chip->mixbuff[0] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[0] += (Bit16s)(accm * chip->channel[ii].fcha);
		}
		else {
			chip->mixbuff[0] += (Bit16s)(accm & chip->channel[ii].cha);
		}
	}

	for (Bit8u ii = 15; ii < 18; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm2(chip);
	}
	else {
		slot_generate(&chip->slot[15]);
		slot_generate(&chip->slot[16]);
		slot_generate(&chip->slot[17]);
	}

	buff[0] = limshort(chip->mixbuff[0]);

	for (Bit8u ii = 18; ii < 33; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	chip->mixbuff[1] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[1] += (Bit16s)(accm * chip->channel[ii].fchb);
		}
		else {
			chip->mixbuff[1] += (Bit16s)(accm & chip->channel[ii].chb);
		}
	}

	for (Bit8u ii = 33; ii < 36; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	n_generate(chip);

	if ((chip->timer & 0x3f) == 0x3f) {
		if (!chip->tremdir) {
			if (chip->tremtval == 105) {
				chip->tremtval--;
				chip->tremdir = 1;
			}
			else {
				chip->tremtval++;
			}
		}
		else {
			if (chip->tremtval == 0) {
				chip->tremtval++;
				chip->tremdir = 0;
			}
			else {
				chip->tremtval--;
			}
		}
		chip->tremval = (chip->tremtval >> 2) >> ((1 - chip->dam) << 1);
	}

	chip->timer++;
}